

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint readChunk_bKGD(LodePNGInfo *info,uchar *data,size_t chunkLength)

{
  uint uVar1;
  long lStack_8;
  
  switch((info->color).colortype) {
  case LCT_GREY:
  case LCT_GREY_ALPHA:
    if (chunkLength != 2) {
      return 0x2c;
    }
    info->background_defined = 1;
    uVar1 = (uint)(ushort)(*(ushort *)data << 8 | *(ushort *)data >> 8);
    break;
  default:
    goto switchD_00128562_caseD_1;
  case LCT_RGB:
  case LCT_RGBA:
    if (chunkLength != 6) {
      return 0x2d;
    }
    info->background_defined = 1;
    info->background_r = (uint)(ushort)(*(ushort *)data << 8 | *(ushort *)data >> 8);
    info->background_g = (uint)(ushort)(*(ushort *)(data + 2) << 8 | *(ushort *)(data + 2) >> 8);
    uVar1 = (uint)(ushort)(*(ushort *)(data + 4) << 8 | *(ushort *)(data + 4) >> 8);
    lStack_8 = 0x44;
    goto LAB_001285ba;
  case LCT_PALETTE:
    if (chunkLength != 1) {
      return 0x2b;
    }
    if ((info->color).palettesize <= (ulong)*data) {
      return 0x67;
    }
    info->background_defined = 1;
    uVar1 = (uint)*data;
  }
  info->background_b = uVar1;
  info->background_g = uVar1;
  lStack_8 = 0x3c;
LAB_001285ba:
  *(uint *)((long)&info->compression_method + lStack_8) = uVar1;
switchD_00128562_caseD_1:
  return 0;
}

Assistant:

static unsigned readChunk_bKGD(LodePNGInfo* info, const unsigned char* data, size_t chunkLength) {
  if (info->color.colortype == LCT_PALETTE) {
    /*error: this chunk must be 1 byte for indexed color image*/
    if (chunkLength != 1) return 43;

    /*error: invalid palette index, or maybe this chunk appeared before PLTE*/
    if (data[0] >= info->color.palettesize) return 103;

    info->background_defined = 1;
    info->background_r = info->background_g = info->background_b = data[0];
  }
  else if (info->color.colortype == LCT_GREY || info->color.colortype == LCT_GREY_ALPHA) {
    /*error: this chunk must be 2 bytes for grayscale image*/
    if (chunkLength != 2) return 44;

    /*the values are truncated to bitdepth in the PNG file*/
    info->background_defined = 1;
    info->background_r = info->background_g = info->background_b = 256u * data[0] + data[1];
  }
  else if (info->color.colortype == LCT_RGB || info->color.colortype == LCT_RGBA) {
    /*error: this chunk must be 6 bytes for grayscale image*/
    if (chunkLength != 6) return 45;

    /*the values are truncated to bitdepth in the PNG file*/
    info->background_defined = 1;
    info->background_r = 256u * data[0] + data[1];
    info->background_g = 256u * data[2] + data[3];
    info->background_b = 256u * data[4] + data[5];
  }

  return 0; /* OK */
}